

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key,TypeBase **value)

{
  Node *this_00;
  Node *pNVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint local_5c;
  InplaceStr local_48;
  ModuleData *local_38;
  
  local_48.begin = (char *)0x0;
  local_48.end = (char *)0x0;
  local_38 = (ModuleData *)0x0;
  bVar3 = InplaceStr::operator==(&key->typeName,&local_48);
  if ((bVar3) && (key->importModule == local_38)) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<TypeModulePair, TypeBase *, TypeModulePairHasher, 32>::insert(const Key &, const Value &) [Key = TypeModulePair, Value = TypeBase *, Hasher = TypeModulePairHasher, N = 32]"
                 );
  }
  local_5c = this->bucketCount;
  if (local_5c <= (this->count >> 2) + this->count) {
    rehash(this);
    local_5c = this->bucketCount;
  }
  uVar4 = NULLC::GetStringHash((key->typeName).begin,(key->typeName).end);
  uVar5 = NULLC::GetStringHash((key->importModule->name).begin,(key->importModule->name).end);
  if (this->bucketCount != 0) {
    uVar5 = uVar5 + uVar4;
    uVar4 = 0;
    do {
      uVar5 = uVar5 & local_5c - 1;
      pNVar1 = this->data;
      this_00 = pNVar1 + uVar5;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      local_38 = (ModuleData *)0x0;
      bVar3 = InplaceStr::operator==((InplaceStr *)this_00,&local_48);
      if ((bVar3) && (pNVar1[uVar5].key.importModule == local_38)) {
        (this_00->key).importModule = key->importModule;
        pcVar2 = (key->typeName).end;
        (this_00->key).typeName.begin = (key->typeName).begin;
        (this_00->key).typeName.end = pcVar2;
        this_00->value = *value;
        this->count = this->count + 1;
        return;
      }
      bVar3 = InplaceStr::operator==((InplaceStr *)this_00,&key->typeName);
      if ((bVar3) && ((this_00->key).importModule == key->importModule)) {
        this_00->value = *value;
        return;
      }
      uVar5 = uVar5 + uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucketCount);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<TypeModulePair, TypeBase *, TypeModulePairHasher, 32>::insert(const Key &, const Value &) [Key = TypeModulePair, Value = TypeBase *, Hasher = TypeModulePairHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}